

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveFile.cpp
# Opt level: O3

int __thiscall ExclusiveFile::get_fd(ExclusiveFile *this)

{
  runtime_error *this_00;
  
  if (this->fd != -1) {
    return this->fd;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Trying to extract descriptor from failed open()");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int ExclusiveFile::get_fd() {
    if (fd == -1) {
        throw std::runtime_error(
            "Trying to extract descriptor from failed open()");
    }
    return fd;
}